

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O3

void png_read_filter_row_sub(png_row_infop row_info,png_bytep row,png_const_bytep prev_row)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  
  uVar1 = row_info->rowbytes;
  uVar2 = (ulong)(row_info->pixel_depth + 7 >> 3);
  if (uVar2 < uVar1) {
    lVar3 = 0;
    do {
      row[lVar3 + uVar2] = row[lVar3 + uVar2] + row[lVar3];
      lVar3 = lVar3 + 1;
    } while (uVar1 - uVar2 != lVar3);
  }
  return;
}

Assistant:

static void
png_read_filter_row_sub(png_row_infop row_info, png_bytep row,
    png_const_bytep prev_row)
{
   size_t i;
   size_t istop = row_info->rowbytes;
   unsigned int bpp = (row_info->pixel_depth + 7) >> 3;
   png_bytep rp = row + bpp;

   PNG_UNUSED(prev_row)

   for (i = bpp; i < istop; i++)
   {
      *rp = (png_byte)(((int)(*rp) + (int)(*(rp-bpp))) & 0xff);
      rp++;
   }
}